

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O3

el_action_t vi_repeat_search_prev(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  
  if ((el->el_search).patlen != 0) {
    eVar1 = cv_repeat_srch(el,((el->el_search).patdir != L'\x18') + 0x17);
    return eVar1;
  }
  return '\x06';
}

Assistant:

libedit_private el_action_t
vi_repeat_search_prev(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_search.patlen == 0)
		return CC_ERROR;
	else
		return (cv_repeat_srch(el,
		    el->el_search.patdir == ED_SEARCH_PREV_HISTORY ?
		    ED_SEARCH_NEXT_HISTORY : ED_SEARCH_PREV_HISTORY));
}